

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_utils.c
# Opt level: O1

uint32_t utf8_charbytes(char *s,uint32_t i)

{
  byte bVar1;
  uint32_t uVar2;
  
  bVar1 = s[i];
  uVar2 = 1;
  if ((((char)bVar1 < '\x01') && (uVar2 = 2, 0x1d < (byte)(bVar1 + 0x3e))) &&
     (uVar2 = 3, (bVar1 & 0xf0) != 0xe0)) {
    return (uint)((byte)(bVar1 + 0x10) < 5) << 2;
  }
  return uVar2;
}

Assistant:

inline uint32_t utf8_charbytes (const char *s, uint32_t i) {
    unsigned char c = (unsigned char)s[i];
    
    // determine bytes needed for character, based on RFC 3629
    if ((c > 0) && (c <= 127)) return 1;
    if ((c >= 194) && (c <= 223)) return 2;
    if ((c >= 224) && (c <= 239)) return 3;
    if ((c >= 240) && (c <= 244)) return 4;
    
    // means error
    return 0;
}